

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_CORE_LL_HANDLE
IoTHubClientCore_LL_CreateImpl(IOTHUB_CLIENT_CONFIG *config,char *module_id,_Bool use_dev_auth)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  IOTHUB_CLIENT_CORE_LL_HANDLE result;
  _Bool use_dev_auth_local;
  char *module_id_local;
  IOTHUB_CLIENT_CONFIG *config_local;
  
  if ((config == (IOTHUB_CLIENT_CONFIG *)0x0) ||
     (config->protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0)) {
    l = (LOGGER_LOG)0x0;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_CreateImpl",0x688,1,"invalid configuration (NULL detected)");
    }
  }
  else {
    l = (LOGGER_LOG)
        initialize_iothub_client(config,(IOTHUB_CLIENT_DEVICE_CONFIG *)0x0,use_dev_auth,module_id);
    if ((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l == (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_CreateImpl",0x68f,1,"initialize iothub client");
      }
      l = (LOGGER_LOG)0x0;
    }
  }
  return (IOTHUB_CLIENT_CORE_LL_HANDLE)l;
}

Assistant:

IOTHUB_CLIENT_CORE_LL_HANDLE IoTHubClientCore_LL_CreateImpl(const IOTHUB_CLIENT_CONFIG* config, const char* module_id, bool use_dev_auth)
{
    IOTHUB_CLIENT_CORE_LL_HANDLE result;
    if(
        (config == NULL) ||
        (config->protocol == NULL)
        )
    {
        result = NULL;
        LogError("invalid configuration (NULL detected)");
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = initialize_iothub_client(config, NULL, use_dev_auth, module_id);
        if (handleData == NULL)
        {
            LogError("initialize iothub client");
            result = NULL;
        }
        else
        {
            result = handleData;
        }
    }

    return result;
}